

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeGetNumLinSolvSetups(void *arkode_mem,long *nlinsetups)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,2999,"ARKodeGetNumLinSolvSetups",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    if (*(code **)((long)arkode_mem + 0x1d0) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0x1d0))();
      return iVar1;
    }
    *nlinsetups = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ARKodeGetNumLinSolvSetups(void* arkode_mem, long int* nlinsetups)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Call stepper routine to compute the state (if provided) */
  if (ark_mem->step_getnumlinsolvsetups)
  {
    return (ark_mem->step_getnumlinsolvsetups(ark_mem, nlinsetups));
  }
  else
  {
    *nlinsetups = 0;
    return (ARK_SUCCESS);
  }
}